

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O0

void __thiscall
nonstd::vptr::detail::
compressed_ptr<std::pair<char,_(anonymous_namespace)::S>,_nonstd::vptr::detail::default_clone<std::pair<char,_(anonymous_namespace)::S>_>,_std::default_delete<std::pair<char,_(anonymous_namespace)::S>_>_>
::reset(compressed_ptr<std::pair<char,_(anonymous_namespace)::S>,_nonstd::vptr::detail::default_clone<std::pair<char,_(anonymous_namespace)::S>_>,_std::default_delete<std::pair<char,_(anonymous_namespace)::S>_>_>
        *this,element_type *v)

{
  cloner_type *this_00;
  pair<char,_(anonymous_namespace)::S> *p;
  element_type *v_local;
  compressed_ptr<std::pair<char,_(anonymous_namespace)::S>,_nonstd::vptr::detail::default_clone<std::pair<char,_(anonymous_namespace)::S>_>,_std::default_delete<std::pair<char,_(anonymous_namespace)::S>_>_>
  *this_local;
  
  this_00 = get_cloner(this);
  p = default_clone<std::pair<char,_(anonymous_namespace)::S>_>::operator()(this_00,v);
  reset(this,p);
  return;
}

Assistant:

void reset( element_type && v )
    {
        reset( get_cloner()( std::move( v ) ) );
    }